

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O0

int utc_from_posix_time(int64_t time,int *out_year,int *out_month,int *out_day,int *out_hours,
                       int *out_minutes,int *out_seconds)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int local_b0;
  long local_88;
  int64_t month_of_year;
  int64_t day_of_year;
  int64_t year_of_era;
  int64_t day_of_era;
  int64_t era;
  int64_t leftover_seconds;
  int64_t days;
  int *out_minutes_local;
  int *out_hours_local;
  int *out_day_local;
  int *out_month_local;
  int *out_year_local;
  int64_t time_local;
  
  iVar1 = is_valid_posix_time(time);
  if (iVar1 == 0) {
    time_local._4_4_ = 0;
  }
  else {
    leftover_seconds = time / 0x15180;
    era = time % 0x15180;
    if (era < 0) {
      leftover_seconds = leftover_seconds + -1;
      era = era + 0x15180;
    }
    lVar2 = leftover_seconds + 0xafa6c;
    if (lVar2 < -0x3d || 0x37bb0c < lVar2) {
      __assert_fail("-61 <= days && days <= 3652364",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/posix_time.cc"
                    ,0x7f,
                    "int utc_from_posix_time(int64_t, int *, int *, int *, int *, int *, int *)");
    }
    local_88 = lVar2;
    if (lVar2 < 1) {
      local_88 = leftover_seconds + 0x8bfbc;
    }
    lVar2 = lVar2 + (local_88 / 0x23ab1) * -0x23ab1;
    lVar3 = (((lVar2 - lVar2 / 0x5b4) + lVar2 / 0x8eac) - lVar2 / 0x23ab0) / 0x16d;
    *out_year = (int)lVar3 + (int)(local_88 / 0x23ab1) * 400;
    lVar2 = lVar2 - ((lVar3 * 0x16d + lVar3 / 4) - lVar3 / 100);
    lVar3 = (lVar2 * 5 + 2) / 0x99;
    if (lVar3 < 10) {
      local_b0 = (int)lVar3 + 3;
    }
    else {
      local_b0 = (int)lVar3 + -9;
    }
    *out_month = local_b0;
    if (*out_month < 3) {
      *out_year = *out_year + 1;
    }
    *out_day = ((int)lVar2 - (int)((lVar3 * 0x99 + 2) / 5)) + 1;
    *out_hours = (int)(era / 0xe10);
    *out_minutes = (int)((era % 0xe10) / 0x3c);
    *out_seconds = (int)((era % 0xe10) % 0x3c);
    time_local._4_4_ = 1;
  }
  return time_local._4_4_;
}

Assistant:

static int utc_from_posix_time(int64_t time, int *out_year, int *out_month,
                               int *out_day, int *out_hours, int *out_minutes,
                               int *out_seconds) {
  if (!is_valid_posix_time(time)) {
    return 0;
  }
  int64_t days = time / SECS_PER_DAY;
  int64_t leftover_seconds = time % SECS_PER_DAY;
  if (leftover_seconds < 0) {
    days--;
    leftover_seconds += SECS_PER_DAY;
  }
  days += 719468;  // Shift to starting epoch of Mar 1 0000.
  // At this point, days will be in the range -61 and 3652364.
  assert(-61 <= days && days <= 3652364);
  int64_t era = (days > 0 ? days : days - 146096) / 146097;
  int64_t day_of_era = days - era * 146097;
  int64_t year_of_era = (day_of_era - day_of_era / 1460 + day_of_era / 36524 -
                         day_of_era / 146096) /
                        365;
  *out_year = (int)(year_of_era + era * 400);  // Year starting on Mar 1.
  int64_t day_of_year =
      day_of_era - (365 * year_of_era + year_of_era / 4 - year_of_era / 100);
  int64_t month_of_year = (5 * day_of_year + 2) / 153;
  *out_month =
      (int)(month_of_year < 10 ? month_of_year + 3 : month_of_year - 9);
  if (*out_month <= 2) {
    (*out_year)++;  // Adjust year back to Jan 1 start of year.
  }
  *out_day = (int)(day_of_year - (153 * month_of_year + 2) / 5 + 1);
  *out_hours = (int)(leftover_seconds / SECS_PER_HOUR);
  leftover_seconds %= SECS_PER_HOUR;
  *out_minutes = (int)(leftover_seconds / 60);
  *out_seconds = (int)(leftover_seconds % 60);
  return 1;
}